

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jchuff.c
# Opt level: O2

void emit_buffered_bits(huff_entropy_ptr_conflict entropy,char *bufstart,uint nbits)

{
  long lVar1;
  
  if ((nbits != 0) && (entropy->gather_statistics == 0)) {
    lVar1 = 0;
    do {
      emit_bits_e(entropy,(int)bufstart[lVar1],1);
      lVar1 = lVar1 + 1;
    } while (nbits != (uint)lVar1);
  }
  return;
}

Assistant:

LOCAL(void)
emit_buffered_bits (huff_entropy_ptr entropy, char * bufstart,
		    unsigned int nbits)
{
  if (entropy->gather_statistics)
    return;			/* no real work */

  while (nbits > 0) {
    emit_bits_e(entropy, (unsigned int) (*bufstart), 1);
    bufstart++;
    nbits--;
  }
}